

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRC_Client.cpp
# Opt level: O1

int __thiscall Jupiter::IRC::Client::readConfigInt(Client *this,string_view key,int defaultValue)

{
  uint uVar1;
  size_t length;
  const_iterator cVar3;
  string_view sVar4;
  basic_string_view<char,_std::char_traits<char>_> local_38;
  size_t sVar2;
  
  if (this->m_primary_section != (Config *)0x0) {
    sVar4 = Config::get(this->m_primary_section,key,(string_view)ZEXT816(0));
    length = sVar4._M_len;
    sVar2 = length;
    if (length != 0) {
      uVar1 = Jupiter_strtoi_s(sVar4._M_str,length,0);
      sVar2 = (size_t)uVar1;
    }
    if (length != 0) {
      return (int)sVar2;
    }
  }
  if ((this->m_secondary_section != (Config *)0x0) &&
     (local_38._M_len = key._M_len, local_38._M_str = key._M_str,
     cVar3 = std::
             _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,jessilib::text_equali,jessilib::text_hashi,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
             ::_M_find_tr<std::basic_string_view<char,std::char_traits<char>>,void,void>
                       ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,jessilib::text_equali,jessilib::text_hashi,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                         *)&this->m_secondary_section->m_table,&local_38),
     cVar3.
     super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
     ._M_cur != (__node_type *)0x0)) {
    defaultValue = Jupiter_strtoi_s(*(char **)((long)cVar3.
                                                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                                                  ._M_cur + 0x28),
                                    *(size_t *)
                                     ((long)cVar3.
                                            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                                            ._M_cur + 0x30),0);
  }
  return defaultValue;
}

Assistant:

int Jupiter::IRC::Client::readConfigInt(std::string_view key, int defaultValue) const {
	if (m_primary_section != nullptr) {
		std::string_view val = m_primary_section->get(key);

		if (!val.empty()) {
			return Jupiter::from_string<int>(val);
		}
	}

	if (m_secondary_section != nullptr) {
		return m_secondary_section->get<int>(key, defaultValue);
	}

	return defaultValue;
}